

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmetadata_p.h
# Opt level: O0

QDateTime __thiscall QFileSystemMetaData::accessTime(QFileSystemMetaData *this)

{
  long lVar1;
  QTimeZone *in_RSI;
  Data in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffd8;
  byte bVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = 0;
  if (in_RSI[2].d.d == (QTimeZonePrivate *)0x0) {
    QDateTime::QDateTime((QDateTime *)0x19b266);
  }
  else {
    QTimeZone::QTimeZone((QTimeZone *)in_RDI.d,SUB84(in_RSI[2].d,4));
    bVar2 = 1;
    QDateTime::fromMSecsSinceEpoch(CONCAT17(1,in_stack_ffffffffffffffd8),in_RSI);
  }
  if ((bVar2 & 1) != 0) {
    QTimeZone::~QTimeZone((QTimeZone *)0x19b279);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QDateTime)in_RDI;
}

Assistant:

inline QDateTime QFileSystemMetaData::accessTime() const
{
    return accessTime_
        ? QDateTime::fromMSecsSinceEpoch(accessTime_, QTimeZone::UTC)
        : QDateTime();
}